

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-sampling.cpp
# Opt level: O2

void test_xtc(vector<float,_std::allocator<float>_> *probs,
             vector<float,_std::allocator<float>_> *probs_expected,float p,float t)

{
  llama_sampler *sampler;
  sampler_tester tester;
  
  sampler_tester::sampler_tester(&tester,probs,probs_expected);
  printf("%s:%d (%s)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-sampling.cpp"
         ,0x7a,"test_xtc");
  dump(&tester.cur_p);
  puts("-");
  sampler = (llama_sampler *)llama_sampler_init_xtc(0x3f7d70a4,p,0,0);
  sampler_tester::apply(&tester,sampler);
  printf("%s:%d (%s)\n",
         "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/tests/test-sampling.cpp"
         ,0x7c,"test_xtc");
  dump(&tester.cur_p);
  puts("-");
  sampler_tester::check(&tester);
  sampler_tester::~sampler_tester(&tester);
  return;
}

Assistant:

static void test_xtc(const std::vector<float> & probs, const std::vector<float> & probs_expected, float p, float t) {
    sampler_tester tester(probs, probs_expected);

    DUMP(&tester.cur_p);
    tester.apply(llama_sampler_init_xtc(p, t, 0, 0));
    DUMP(&tester.cur_p);

    tester.check();
}